

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_thunder.c
# Opt level: O0

int ThunderDecodeRow(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  int iVar1;
  uint8_t *local_38;
  uint8_t *row;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *buf_local;
  TIFF *tif_local;
  
  local_38 = buf;
  tStack_28 = occ;
  if (occ % tif->tif_scanlinesize == 0) {
    for (; 0 < tStack_28; tStack_28 = tStack_28 - tif->tif_scanlinesize) {
      iVar1 = ThunderDecode(tif,local_38,(ulong)(tif->tif_dir).td_imagewidth);
      if (iVar1 == 0) {
        return 0;
      }
      local_38 = local_38 + tif->tif_scanlinesize;
    }
    tif_local._4_4_ = 1;
  }
  else {
    TIFFErrorExtR(tif,"ThunderDecodeRow","Fractional scanlines cannot be read");
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

static int ThunderDecodeRow(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "ThunderDecodeRow";
    uint8_t *row = buf;

    (void)s;
    if (occ % tif->tif_scanlinesize)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    while (occ > 0)
    {
        if (!ThunderDecode(tif, row, tif->tif_dir.td_imagewidth))
            return (0);
        occ -= tif->tif_scanlinesize;
        row += tif->tif_scanlinesize;
    }
    return (1);
}